

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O2

void InitializeContentFromParent<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>,unsigned_long>
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *parentContent,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *thisContent,
               vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_> *parentBacktraces,
               vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_> *thisBacktraces,
               unsigned_long *contentEndPosition)

{
  pointer pbVar1;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __last;
  allocator_type local_69;
  vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_> *local_68;
  unsigned_long *local_60;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_58 [3];
  _Alloc_hider local_40;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_38;
  
  pbVar1 = (parentContent->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  __last._M_current =
       (parentContent->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  local_68 = thisBacktraces;
  local_60 = contentEndPosition;
  local_40._M_p = (pointer)pbVar1;
  local_38.current._M_current =
       (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        )(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          )__last._M_current;
  std::
  find<std::reverse_iterator<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,std::__cxx11::string>
            ((reverse_iterator<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)local_58,&local_38,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_40);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  vector<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_58,
             local_58[0],__last,&local_69);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign(thisContent,
                   (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_58);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_58);
  std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>::
  vector<__gnu_cxx::__normal_iterator<cmListFileBacktrace_const*,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>>,void>
            ((vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>> *)local_58,
             (cmListFileBacktrace *)
             (((long)local_58[0]._M_current - (long)pbVar1) * 2 +
             (long)(parentBacktraces->
                   super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>).
                   _M_impl.super__Vector_impl_data._M_start),
             (parentBacktraces->
             super__Vector_base<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>)._M_impl.
             super__Vector_impl_data._M_finish,(allocator_type *)&local_69);
  std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::_M_move_assign
            (local_68,(vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>> *)local_58);
  std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::~vector
            ((vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_> *)local_58);
  *local_60 = (long)(thisContent->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(thisContent->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 5;
  return;
}

Assistant:

void InitializeContentFromParent(T& parentContent,
                          T& thisContent,
                          U& parentBacktraces,
                          U& thisBacktraces,
                          V& contentEndPosition)
{
  std::vector<std::string>::const_iterator parentBegin =
      parentContent.begin();
  std::vector<std::string>::const_iterator parentEnd =
      parentContent.end();

  std::vector<std::string>::const_reverse_iterator parentRbegin =
      cmMakeReverseIterator(parentEnd);
  std::vector<std::string>::const_reverse_iterator parentRend =
      parentContent.rend();
  parentRbegin = std::find(parentRbegin, parentRend, cmPropertySentinal);
  std::vector<std::string>::const_iterator parentIt = parentRbegin.base();

  thisContent = std::vector<std::string>(parentIt, parentEnd);

  std::vector<cmListFileBacktrace>::const_iterator btIt =
      parentBacktraces.begin() + std::distance(parentBegin, parentIt);
  std::vector<cmListFileBacktrace>::const_iterator btEnd =
      parentBacktraces.end();

  thisBacktraces = std::vector<cmListFileBacktrace>(btIt, btEnd);

  contentEndPosition = thisContent.size();
}